

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

http_content_type_t get_file_MIME_type(char *filename)

{
  int iVar1;
  char *__s1;
  http_content_type_t hVar2;
  http_content_type_t hVar3;
  char **ppcVar4;
  
  __s1 = strrchr(filename,0x2e);
  hVar2 = INVALID_MIME;
  if (__s1 != (char *)0x0) {
    hVar3 = text_html;
    ppcVar4 = file_ext;
    while ((hVar2 = INVALID_MIME, *ppcVar4 != (char *)0x0 &&
           (iVar1 = strncmp(__s1,*ppcVar4,5), hVar2 = hVar3, iVar1 != 0))) {
      hVar3 = hVar3 + image_jpg;
      ppcVar4 = ppcVar4 + 1;
    }
  }
  return hVar2;
}

Assistant:

http_content_type_t get_file_MIME_type(const char* filename)
{
  char *fileExtension;
  if ((fileExtension = strrchr(filename, '.')) == NULL)
    return INVALID_MIME;

  http_content_type_t mime = text_html;

  for (int i = 0; file_ext[i] != NULL; ++i, ++mime)
    if (!(strncmp(fileExtension, file_ext[i], 5)))
      return mime;
  return INVALID_MIME;

}